

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_BuildInFunctionPrintDefined_Test::
~SemanticAnalyserTest_BuildInFunctionPrintDefined_Test
          (SemanticAnalyserTest_BuildInFunctionPrintDefined_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_BuildInFunctionPrintDefined_Test
            ((SemanticAnalyserTest_BuildInFunctionPrintDefined_Test *)0x1e8c18);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, BuildInFunctionPrintDefined)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    print("test");
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}